

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O1

bool __thiscall
cpptrace::detail::libdwarf::die_object::has_attr(die_object *this,Dwarf_Half attr_num)

{
  int iVar1;
  Dwarf_Bool present;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  Dwarf_Error local_10;
  
  iVar2 = 0;
  local_10 = (Dwarf_Error)0x0;
  iVar1 = dwarf_hasattr(this->die,attr_num,(Dwarf_Bool *)&stack0xffffffffffffffec,&local_10);
  if (iVar1 == 1) {
    handle_dwarf_error(this->dbg,local_10);
  }
  if (iVar1 == 0) {
    return iVar2 != 0;
  }
  assert_fail((detail *)0x1,0x196c14,
              "bool cpptrace::detail::libdwarf::die_object::has_attr(Dwarf_Half) const",
              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
              ,(source_location)ZEXT816(0xae),(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
}

Assistant:

bool has_attr(Dwarf_Half attr_num) const {
            Dwarf_Bool present = false;
            VERIFY(wrap(dwarf_hasattr, die, attr_num, &present) == DW_DLV_OK);
            return present;
        }